

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cc
# Opt level: O3

type_info * get_type_info_entry(_Unwind_Context *context,dwarf_eh_lsda *lsda,int filter)

{
  int iVar1;
  dw_eh_ptr_t puVar2;
  uint64_t v;
  type_info *ptVar3;
  uint uVar4;
  dw_eh_ptr_t record;
  dw_eh_ptr_t local_20;
  
  uVar4 = lsda->type_table_encoding & 0xf;
  if (((byte)uVar4 < 0xd) && ((0x1c1dU >> uVar4 & 1) != 0)) {
    iVar1 = *(int *)(&DAT_00110ee0 + (ulong)uVar4 * 4);
    puVar2 = lsda->type_table;
    local_20 = puVar2 + -(ulong)(uint)(filter * iVar1);
    v = read_value(lsda->type_table_encoding,&local_20);
    if (v == 0) {
      ptVar3 = (type_info *)0x0;
    }
    else {
      ptVar3 = (type_info *)
               resolve_indirect_value
                         (context,lsda->type_table_encoding,v,
                          puVar2 + -(ulong)(uint)(filter * iVar1));
    }
    return ptVar3;
  }
  abort();
}

Assistant:

static std::type_info *get_type_info_entry(_Unwind_Context *context,
                                           dwarf_eh_lsda *lsda,
                                           int filter)
{
	// Get the address of the record in the table.
	dw_eh_ptr_t record = lsda->type_table - 
		dwarf_size_of_fixed_size_field(lsda->type_table_encoding)*filter;
	//record -= 4;
	dw_eh_ptr_t start = record;
	// Read the value, but it's probably an indirect reference...
	int64_t offset = read_value(lsda->type_table_encoding, &record);

	// (If the entry is 0, don't try to dereference it.  That would be bad.)
	if (offset == 0) { return 0; }

	// ...so we need to resolve it
	return reinterpret_cast<std::type_info*>(resolve_indirect_value(context,
			lsda->type_table_encoding, offset, start));
}